

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetSchnorrPubkeyFromPubkey(void *handle,char *pubkey,char **schnorr_pubkey,bool *parity)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  bool *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  SchnorrPubkey schnorr_pubkey_obj;
  Pubkey pubkey_obj;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe90;
  allocator *paVar4;
  string *in_stack_fffffffffffffed0;
  SchnorrPubkey local_110;
  allocator local_f1;
  string local_f0;
  Pubkey local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  bool *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_20 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x1c2;
    local_50.funcname = "CfdGetSchnorrPubkeyFromPubkey";
    cfd::core::logger::warn<>(&local_50,"schnorr pubkey is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. schnorr pubkey is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    paVar4 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,local_18,paVar4);
    cfd::core::Pubkey::Pubkey(&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    cfd::core::SchnorrPubkey::FromPubkey(&local_110,&local_d0,local_28);
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffed0,&local_110);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffed0);
    *local_20 = pcVar3;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    local_4 = 0;
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5ce76f);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5ce77c);
    return local_4;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x1c8;
  local_90.funcname = "CfdGetSchnorrPubkeyFromPubkey";
  cfd::core::logger::warn<>(&local_90,"pubkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. pubkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSchnorrPubkeyFromPubkey(
    void* handle, const char* pubkey, char** schnorr_pubkey, bool* parity) {
  try {
    cfd::Initialize();
    if (schnorr_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "schnorr pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. schnorr pubkey is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey pubkey_obj = Pubkey(std::string(pubkey));
    SchnorrPubkey schnorr_pubkey_obj =
        SchnorrPubkey::FromPubkey(pubkey_obj, parity);
    *schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}